

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcf_re_repeat(int n,mpc_val_t **xs)

{
  char cVar1;
  int n_00;
  int *__ptr;
  mpc_parser_t *pmVar2;
  
  __ptr = (int *)xs[1];
  if (__ptr == (int *)0x0) {
    return *xs;
  }
  cVar1 = (char)*__ptr;
  if (cVar1 == '?') {
    free(__ptr);
    pmVar2 = mpc_maybe_lift((mpc_parser_t *)*xs,mpcf_ctor_str);
    return pmVar2;
  }
  if (cVar1 == '+') {
    free(__ptr);
    pmVar2 = mpc_many1(mpcf_strfold,(mpc_parser_t *)*xs);
    return pmVar2;
  }
  if (cVar1 == '*') {
    free(__ptr);
    pmVar2 = mpc_many(mpcf_strfold,(mpc_parser_t *)*xs);
    return pmVar2;
  }
  n_00 = *__ptr;
  free(__ptr);
  pmVar2 = mpc_count(n_00,mpcf_strfold,(mpc_parser_t *)*xs,free);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcf_re_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpc_many(mpcf_strfold, xs[0]); }; break;
    case '+': { free(xs[1]); return mpc_many1(mpcf_strfold, xs[0]); }; break;
    case '?': { free(xs[1]); return mpc_maybe_lift(xs[0], mpcf_ctor_str); }; break;
    default:
      num = *(int*)xs[1];
      free(xs[1]);
  }

  return mpc_count(num, mpcf_strfold, xs[0], free);
}